

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O0

void __thiscall wasm::Fuzzer::checkLUBs(Fuzzer *this)

{
  bool *this_00;
  HeapType HVar1;
  size_t sVar2;
  bool bVar3;
  __optional_ne_t<wasm::HeapType,_wasm::HeapType> _Var4;
  size_type sVar5;
  const_reference pvVar6;
  HeapType *pHVar7;
  ulong uVar8;
  Fatal *pFVar9;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  __optional_ne_t<wasm::HeapType,_wasm::HeapType> local_d99;
  Fatal local_d80;
  uintptr_t local_bf8;
  bool local_bf0;
  undefined7 uStack_bef;
  Fatal local_be8;
  bool local_a60;
  undefined7 uStack_a5f;
  uintptr_t local_a58;
  Fatal local_a50;
  uintptr_t local_8c8;
  bool local_8c0;
  undefined7 uStack_8bf;
  _Storage<wasm::HeapType,_true> local_8b8;
  optional<wasm::HeapType> lub2;
  _Storage<wasm::HeapType,_true> local_710;
  undefined1 local_708;
  Fatal local_700;
  uintptr_t local_578;
  HeapType local_570;
  _Storage<wasm::HeapType,_true> local_568;
  undefined1 local_560;
  Fatal local_558;
  uintptr_t local_3d0;
  HeapType local_3c8;
  Fatal local_3c0;
  uintptr_t local_238;
  HeapType local_230;
  Fatal local_218;
  bool local_90;
  undefined7 uStack_8f;
  uintptr_t local_88;
  _Storage<wasm::HeapType,_true> local_80;
  undefined1 local_78;
  uintptr_t local_70;
  bool local_68;
  undefined7 uStack_67;
  _Storage<wasm::HeapType,_true> local_60;
  undefined1 local_58;
  uintptr_t local_50;
  uintptr_t local_48;
  _Storage<wasm::HeapType,_true> local_40;
  optional<wasm::HeapType> lub;
  HeapType b;
  HeapType a;
  size_t j;
  size_t i;
  Fuzzer *this_local;
  
  j = 0;
  i = (size_t)this;
  do {
    sVar2 = j;
    sVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
    if (sVar5 <= sVar2) {
      return;
    }
    for (a.id = j; HVar1.id = a.id,
        sVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types),
        HVar1.id < sVar5; a.id = a.id + 1) {
      pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         (&this->types,j);
      b.id = pvVar6->id;
      pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         (&this->types,a.id);
      local_50 = pvVar6->id;
      local_48 = b.id;
      lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = local_50;
      local_40 = (_Storage<wasm::HeapType,_true>)
                 wasm::HeapType::getLeastUpperBound(b,(HeapType)local_50);
      lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL;
      bVar3 = std::optional::operator_cast_to_bool((optional *)&local_40._M_value);
      if (bVar3) {
        local_68 = lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_engaged;
        uStack_67 = lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._9_7_;
        local_70 = b.id;
        local_60 = (_Storage<wasm::HeapType,_true>)
                   wasm::HeapType::getLeastUpperBound
                             ((HeapType)
                              lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::HeapType>._8_8_,b);
        local_58 = extraout_DL_00;
        _Var4 = std::operator!=((optional<wasm::HeapType> *)&local_40._M_value,
                                (optional<wasm::HeapType> *)&local_60._M_value);
        local_d99 = true;
        if (!_Var4) {
          local_88 = b.id;
          local_90 = lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._M_engaged;
          uStack_8f = lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._9_7_;
          local_80 = (_Storage<wasm::HeapType,_true>)
                     wasm::HeapType::getLeastUpperBound
                               (b,(HeapType)
                                  lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                                  super__Optional_payload_base<wasm::HeapType>._8_8_);
          local_78 = extraout_DL_01;
          local_d99 = std::operator!=((optional<wasm::HeapType> *)&local_40._M_value,
                                      (optional<wasm::HeapType> *)&local_80._M_value);
        }
        if (local_d99 != false) {
          Fatal::Fatal(&local_218);
          pFVar9 = Fatal::operator<<(&local_218,
                                     (char (*) [47])"Could not calculate a stable LUB of HeapTypes "
                                    );
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [6])" and ");
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x26537f);
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,&b);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,(HeapType *)
                                            &lub.super__Optional_base<wasm::HeapType,_true,_true>.
                                             _M_payload.super__Optional_payload_base<wasm::HeapType>
                                             ._M_engaged);
          Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          Fatal::~Fatal(&local_218);
        }
        local_230.id = b.id;
        pHVar7 = std::optional<wasm::HeapType>::operator*
                           ((optional<wasm::HeapType> *)&local_40._M_value);
        local_238 = pHVar7->id;
        uVar8 = wasm::HeapType::isSubType(local_230,(HeapType)local_238);
        if ((uVar8 & 1) == 0) {
          Fatal::Fatal(&local_3c0);
          pFVar9 = Fatal::operator<<(&local_3c0,(char (*) [10])0x265319);
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [44])
                                            " is not a subtype of its LUB with HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x26537f);
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,&b);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,(HeapType *)
                                            &lub.super__Optional_base<wasm::HeapType,_true,_true>.
                                             _M_payload.super__Optional_payload_base<wasm::HeapType>
                                             ._M_engaged);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [6])"lub: ");
          pHVar7 = std::optional<wasm::HeapType>::operator*
                             ((optional<wasm::HeapType> *)&local_40._M_value);
          pFVar9 = Fatal::operator<<(pFVar9,pHVar7);
          Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          Fatal::~Fatal(&local_3c0);
        }
        local_3c8.id = lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._8_8_;
        pHVar7 = std::optional<wasm::HeapType>::operator*
                           ((optional<wasm::HeapType> *)&local_40._M_value);
        local_3d0 = pHVar7->id;
        uVar8 = wasm::HeapType::isSubType(local_3c8,(HeapType)local_3d0);
        if ((uVar8 & 1) == 0) {
          Fatal::Fatal(&local_558);
          pFVar9 = Fatal::operator<<(&local_558,(char (*) [10])0x265319);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [44])
                                            " is not a subtype of its LUB with HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x26537f);
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,&b);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,(HeapType *)
                                            &lub.super__Optional_base<wasm::HeapType,_true,_true>.
                                             _M_payload.super__Optional_payload_base<wasm::HeapType>
                                             ._M_engaged);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [6])"lub: ");
          pHVar7 = std::optional<wasm::HeapType>::operator*
                             ((optional<wasm::HeapType> *)&local_40._M_value);
          pFVar9 = Fatal::operator<<(pFVar9,pHVar7);
          Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          Fatal::~Fatal(&local_558);
        }
        local_570.id = b.id;
        pHVar7 = std::optional<wasm::HeapType>::operator*
                           ((optional<wasm::HeapType> *)&local_40._M_value);
        local_578 = pHVar7->id;
        local_568 = (_Storage<wasm::HeapType,_true>)
                    wasm::HeapType::getLeastUpperBound(local_570,(HeapType)local_578);
        local_560 = extraout_DL_02;
        _Var4 = std::operator!=((optional<wasm::HeapType> *)&local_40._M_value,
                                (optional<wasm::HeapType> *)&local_568._M_value);
        if (_Var4) {
          Fatal::Fatal(&local_700);
          pFVar9 = Fatal::operator<<(&local_700,(char (*) [21])"The LUB of HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [15])0x265314);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [43])
                                            " should be the LUB of itself and HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [18])", but it is not!\n");
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,&b);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,(HeapType *)
                                            &lub.super__Optional_base<wasm::HeapType,_true,_true>.
                                             _M_payload.super__Optional_payload_base<wasm::HeapType>
                                             ._M_engaged);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [6])"lub: ");
          pHVar7 = std::optional<wasm::HeapType>::operator*
                             ((optional<wasm::HeapType> *)&local_40._M_value);
          pFVar9 = Fatal::operator<<(pFVar9,pHVar7);
          Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          Fatal::~Fatal(&local_700);
        }
        pHVar7 = std::optional<wasm::HeapType>::operator*
                           ((optional<wasm::HeapType> *)&local_40._M_value);
        local_710 = (_Storage<wasm::HeapType,_true>)
                    wasm::HeapType::getLeastUpperBound
                              ((HeapType)pHVar7->id,
                               (HeapType)
                               lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._8_8_);
        local_708 = extraout_DL_03;
        _Var4 = std::operator!=((optional<wasm::HeapType> *)&local_40._M_value,
                                (optional<wasm::HeapType> *)&local_710._M_value);
        if (_Var4) {
          this_00 = &lub2.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._M_engaged;
          Fatal::Fatal((Fatal *)this_00);
          pFVar9 = Fatal::operator<<((Fatal *)this_00,(char (*) [21])"The LUB of HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [15])0x265314);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [43])
                                            " should be the LUB of itself and HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [18])", but it is not!\n");
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,&b);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,(HeapType *)
                                            &lub.super__Optional_base<wasm::HeapType,_true,_true>.
                                             _M_payload.super__Optional_payload_base<wasm::HeapType>
                                             ._M_engaged);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [6])"lub: ");
          pHVar7 = std::optional<wasm::HeapType>::operator*
                             ((optional<wasm::HeapType> *)&local_40._M_value);
          pFVar9 = Fatal::operator<<(pFVar9,pHVar7);
          Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          Fatal::~Fatal((Fatal *)&lub2.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                                  super__Optional_payload_base<wasm::HeapType>._M_engaged);
        }
      }
      else {
        local_8c0 = lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._M_engaged;
        uStack_8bf = lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._9_7_;
        local_8c8 = b.id;
        local_8b8 = (_Storage<wasm::HeapType,_true>)
                    wasm::HeapType::getLeastUpperBound
                              ((HeapType)
                               lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._8_8_,b);
        lub2.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL_04;
        bVar3 = std::optional::operator_cast_to_bool((optional *)&local_8b8._M_value);
        if (bVar3) {
          Fatal::Fatal(&local_a50);
          pFVar9 = Fatal::operator<<(&local_a50,(char (*) [29])"There is no LUB of HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [15])0x265314);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [48])
                                            ", but there is a LUB in the reverse direction!\n");
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,&b);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,(HeapType *)
                                            &lub.super__Optional_base<wasm::HeapType,_true,_true>.
                                             _M_payload.super__Optional_payload_base<wasm::HeapType>
                                             ._M_engaged);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [6])"lub: ");
          pHVar7 = std::optional<wasm::HeapType>::operator*
                             ((optional<wasm::HeapType> *)&local_8b8._M_value);
          pFVar9 = Fatal::operator<<(pFVar9,pHVar7);
          Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          Fatal::~Fatal(&local_a50);
        }
        local_a58 = b.id;
        local_a60 = lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._M_engaged;
        uStack_a5f = lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._9_7_;
        uVar8 = wasm::HeapType::isSubType
                          (b,(HeapType)
                             lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._8_8_);
        if ((uVar8 & 1) != 0) {
          Fatal::Fatal(&local_be8);
          pFVar9 = Fatal::operator<<(&local_be8,(char (*) [29])"There is no LUB of HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [15])0x265314);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [16])", but HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [27])" is a subtype of HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x26537f);
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,&b);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,(HeapType *)
                                            &lub.super__Optional_base<wasm::HeapType,_true,_true>.
                                             _M_payload.super__Optional_payload_base<wasm::HeapType>
                                             ._M_engaged);
          Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          Fatal::~Fatal(&local_be8);
        }
        local_bf0 = lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._M_engaged;
        uStack_bef = lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._9_7_;
        local_bf8 = b.id;
        uVar8 = wasm::HeapType::isSubType
                          ((HeapType)
                           lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._8_8_,b);
        if ((uVar8 & 1) != 0) {
          Fatal::Fatal(&local_d80);
          pFVar9 = Fatal::operator<<(&local_d80,(char (*) [29])"There is no LUB of HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [15])0x265314);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [16])", but HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [27])" is a subtype of HeapType ");
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x26537f);
          pFVar9 = Fatal::operator<<(pFVar9,&j);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,&b);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          pFVar9 = Fatal::operator<<(pFVar9,&a.id);
          pFVar9 = Fatal::operator<<(pFVar9,(char (*) [3])0x2652e0);
          pFVar9 = Fatal::operator<<(pFVar9,(HeapType *)
                                            &lub.super__Optional_base<wasm::HeapType,_true,_true>.
                                             _M_payload.super__Optional_payload_base<wasm::HeapType>
                                             ._M_engaged);
          Fatal::operator<<(pFVar9,(char (*) [2])0x2654d6);
          Fatal::~Fatal(&local_d80);
        }
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

void Fuzzer::checkLUBs() const {
  // For each unordered pair of types...
  for (size_t i = 0; i < types.size(); ++i) {
    for (size_t j = i; j < types.size(); ++j) {
      HeapType a = types[i], b = types[j];
      // Check that their LUB is stable when calculated multiple times and in
      // reverse order.
      auto lub = HeapType::getLeastUpperBound(a, b);
      if (lub) {
        if (lub != HeapType::getLeastUpperBound(b, a) ||
            lub != HeapType::getLeastUpperBound(a, b)) {
          Fatal() << "Could not calculate a stable LUB of HeapTypes " << i
                  << " and " << j << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n";
        }
        // Check that each type is a subtype of the LUB.
        if (!HeapType::isSubType(a, *lub)) {
          Fatal() << "HeapType " << i
                  << " is not a subtype of its LUB with HeapType " << j << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub << "\n";
        }
        if (!HeapType::isSubType(b, *lub)) {
          Fatal() << "HeapType " << j
                  << " is not a subtype of its LUB with HeapType " << i << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub << "\n";
        }
        // Check that the LUB of each type and the original LUB is still the
        // original LUB.
        if (lub != HeapType::getLeastUpperBound(a, *lub)) {
          Fatal() << "The LUB of HeapType " << i << " and HeapType " << j
                  << " should be the LUB of itself and HeapType " << i
                  << ", but it is not!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub << "\n";
        }
        if (lub != HeapType::getLeastUpperBound(*lub, b)) {
          Fatal() << "The LUB of HeapType " << i << " and HeapType " << j
                  << " should be the LUB of itself and HeapType " << j
                  << ", but it is not!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub << "\n";
        }
      } else {
        // No LUB. Check that this is symmetrical.
        if (auto lub2 = HeapType::getLeastUpperBound(b, a)) {
          Fatal() << "There is no LUB of HeapType " << i << " and HeapType "
                  << j << ", but there is a LUB in the reverse direction!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n"
                  << "lub: " << *lub2 << "\n";
        }
        // There also shouldn't be a subtype relation in this case.
        if (HeapType::isSubType(a, b)) {
          Fatal() << "There is no LUB of HeapType " << i << " and HeapType "
                  << j << ", but HeapType " << i << " is a subtype of HeapType "
                  << j << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n";
        }
        if (HeapType::isSubType(b, a)) {
          Fatal() << "There is no LUB of HeapType " << i << " and HeapType "
                  << j << ", but HeapType " << j << " is a subtype of HeapType "
                  << i << "!\n"
                  << i << ": " << a << "\n"
                  << j << ": " << b << "\n";
        }
      }
    }
  }
}